

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O3

void __thiscall
cbt2DarcShape::getAabb(cbt2DarcShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar1 = this->y;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  fVar2 = (t->m_basis).m_el[2].m_floats[1];
  uVar3 = *(undefined4 *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar17._4_4_ = uVar3;
  auVar17._0_4_ = uVar3;
  auVar17._8_4_ = uVar3;
  auVar17._12_4_ = uVar3;
  fVar7 = this->zthickness * 0.5;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 1),
                          ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]),0x10);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])(t->m_basis).m_el[0].m_floats,
                          ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]),0x10);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 2),
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]),0x10);
  auVar9 = vandps_avx(ZEXT416((uint)fVar2),auVar15);
  auVar8 = ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]);
  auVar10 = vandps_avx(auVar8,auVar15);
  auVar13 = ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]);
  auVar11 = vandps_avx(auVar13,auVar15);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),auVar17,auVar8);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT816(0),auVar13);
  fVar5 = auVar8._0_4_ + (t->m_origin).m_floats[2];
  fVar2 = this->radius;
  auVar16._4_4_ = fVar2;
  auVar16._0_4_ = fVar2;
  auVar16._8_4_ = fVar2;
  auVar16._12_4_ = fVar2;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar2)),auVar16,auVar10);
  auVar9 = vandps_avx(auVar14,auVar15);
  auVar13._0_4_ = fVar1 * auVar14._0_4_;
  auVar13._4_4_ = fVar1 * auVar14._4_4_;
  auVar13._8_4_ = fVar1 * auVar14._8_4_;
  auVar13._12_4_ = fVar1 * auVar14._12_4_;
  auVar14 = vfmadd231ps_fma(auVar13,auVar12,auVar17);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar7),auVar11);
  auVar8._4_4_ = fVar7;
  auVar8._0_4_ = fVar7;
  auVar8._8_4_ = fVar7;
  auVar8._12_4_ = fVar7;
  fVar1 = auVar10._0_4_ + 0.0;
  auVar10 = vandps_avx(auVar12,auVar15);
  auVar11 = vandps_avx(auVar6,auVar15);
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar6,auVar14);
  uVar4 = *(undefined8 *)(t->m_origin).m_floats;
  auVar12._0_4_ = (float)uVar4 + auVar14._0_4_;
  auVar12._4_4_ = (float)((ulong)uVar4 >> 0x20) + auVar14._4_4_;
  auVar12._8_4_ = auVar14._8_4_ + 0.0;
  auVar12._12_4_ = auVar14._12_4_ + 0.0;
  auVar14._0_4_ = fVar2 * auVar9._0_4_;
  auVar14._4_4_ = fVar2 * auVar9._4_4_;
  auVar14._8_4_ = fVar2 * auVar9._8_4_;
  auVar14._12_4_ = fVar2 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar14,auVar16,auVar10);
  auVar10 = vfmadd213ps_fma(auVar8,auVar11,auVar9);
  auVar11 = auVar10;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  auVar9 = auVar11;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar9 = vinsertps_avx(auVar11,auVar9,0x10);
  local_38 = auVar10._0_4_;
  fStack_34 = auVar10._4_4_;
  fStack_30 = auVar10._8_4_;
  fStack_2c = auVar10._12_4_;
  auVar10._0_4_ = auVar9._0_4_ + local_38;
  auVar10._4_4_ = auVar9._4_4_ + fStack_34;
  auVar10._8_4_ = auVar9._8_4_ + fStack_30;
  auVar10._12_4_ = auVar9._12_4_ + fStack_2c;
  auVar9 = vsubps_avx(auVar12,auVar10);
  auVar11._0_4_ = auVar12._0_4_ + auVar10._0_4_;
  auVar11._4_4_ = auVar12._4_4_ + auVar10._4_4_;
  auVar11._8_4_ = auVar12._8_4_ + auVar10._8_4_;
  auVar11._12_4_ = auVar12._12_4_ + auVar10._12_4_;
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar5 - fVar1)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar9;
  auVar9 = vinsertps_avx(auVar11,ZEXT416((uint)(fVar1 + fVar5)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar9;
  return;
}

Assistant:

void cbt2DarcShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
	cbtVector3 halfExtents; 
	halfExtents.setValue((radius), 
						 (radius),
						 (zthickness*0.5f));

	cbtMatrix3x3 abs_b = t.getBasis().absolute();  
	cbtVector3 center = t.getOrigin()+ t.getBasis()*cbtVector3(this->x, this->y, 0);
	cbtVector3 extent = cbtVector3(abs_b[0].dot(halfExtents),
		   abs_b[1].dot(halfExtents),
		  abs_b[2].dot(halfExtents));
	extent += cbtVector3(getMargin(),getMargin(),0);

	aabbMin = center - extent;
	aabbMax = center + extent;

}